

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void __thiscall
kj::(anonymous_namespace)::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  FdOutputStream::~FdOutputStream((FdOutputStream *)this);
  OwnFd::~OwnFd((OwnFd *)(this + -8));
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)(this + -0x10));
  operator_delete(this + -0x18,0x28);
  return;
}

Assistant:

DiskAppendableFile(OwnFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}